

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O1

DdNode * Cudd_addEvalConst(DdManager *dd,DdNode *f,DdNode *g)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *f_00;
  DdNode *pDVar3;
  DdNode *g_00;
  uint uVar4;
  DdNode *g_01;
  
  pDVar2 = g;
  if ((dd->one != f) && ((ulong)g->index != 0x7fffffff)) {
    pDVar3 = dd->zero;
    if (pDVar3 == f) {
      pDVar2 = dd->background;
    }
    else {
      uVar4 = 0x7fffffff;
      if ((ulong)f->index != 0x7fffffff) {
        uVar4 = dd->perm[f->index];
      }
      uVar1 = dd->perm[g->index];
      pDVar2 = cuddConstantLookup(dd,0x66,f,g,g);
      if (pDVar2 == (DdNode *)0x0) {
        f_00 = f;
        pDVar2 = f;
        if (uVar4 <= uVar1) {
          pDVar2 = (f->type).kids.T;
          f_00 = (f->type).kids.E;
        }
        g_00 = g;
        g_01 = g;
        if (uVar1 <= uVar4) {
          g_01 = (g->type).kids.T;
          g_00 = (g->type).kids.E;
        }
        if (pDVar2 == pDVar3) {
          pDVar2 = Cudd_addEvalConst(dd,f_00,g_00);
        }
        else {
          pDVar2 = Cudd_addEvalConst(dd,pDVar2,g_01);
          if (((pDVar2 == (DdNode *)0x1) || (pDVar2->index != 0x7fffffff)) ||
             ((f_00 != pDVar3 &&
              (((pDVar3 = Cudd_addEvalConst(dd,f_00,g_00), pDVar3 == (DdNode *)0x1 ||
                (pDVar2 != pDVar3)) || (pDVar3->index != 0x7fffffff)))))) {
            pDVar2 = (DdNode *)0x1;
          }
        }
        cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,pDVar2);
      }
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addEvalConst(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *zero;
    DdNode *Fv,*Fnv,*Gv,*Gnv,*r,*t,*e;
    unsigned int topf,topg;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    statLine(dd);
    /* Terminal cases. */
    if (f == DD_ONE(dd) || cuddIsConstant(g)) {
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {
        return(dd->background);
    }

#ifdef DD_DEBUG
    assert(!cuddIsConstant(f));
#endif
    /* From now on, f and g are known not to be constants. */

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);

    /* Check cache. */
    r = cuddConstantLookup(dd,DD_ADD_EVAL_CONST_TAG,f,g,g);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= topg) {
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg <= topf) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    
    /* Recursive step. */
    if (Fv != zero) {
        t = Cudd_addEvalConst(dd,Fv,Gv);
        if (t == DD_NON_CONSTANT || !cuddIsConstant(t)) {
            cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, DD_NON_CONSTANT);
            return(DD_NON_CONSTANT);
        }
        if (Fnv != zero) {
            e = Cudd_addEvalConst(dd,Fnv,Gnv);
            if (e == DD_NON_CONSTANT || !cuddIsConstant(e) || t != e) {
                cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, DD_NON_CONSTANT);
                return(DD_NON_CONSTANT);
            }
        }
        cuddCacheInsert2(dd,Cudd_addEvalConst,f,g,t);
        return(t);
    } else { /* Fnv must be != zero */
        e = Cudd_addEvalConst(dd,Fnv,Gnv);
        cuddCacheInsert2(dd, Cudd_addEvalConst, f, g, e);
        return(e);
    }

}